

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,longlong *v,longlong v_min,
               longlong v_max,char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  float *pfVar4;
  longlong lVar5;
  long *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  long in_R8;
  long in_R9;
  bool bVar6;
  bool bVar7;
  float fVar8;
  float axis_00;
  float fVar9;
  float fVar10;
  float lhs;
  float fVar11;
  float fVar12;
  uint in_stack_00000010;
  ImVec2 *in_stack_00000018;
  float grab_pos_1;
  float grab_t_1;
  longlong v_new_1;
  float new_clicked_t;
  longlong v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  bool tweak_fast;
  bool tweak_slow;
  float input_delta;
  bool clicked_around_grab;
  float grab_pos;
  float grab_t;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  float v_range_f;
  bool is_floating_point;
  bool is_logarithmic;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  int local_114;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  char cVar13;
  float in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  long local_f8;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  float local_c4;
  ImRect local_c0;
  longlong local_b0;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  ImGuiDataType data_type_00;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined1 is_logarithmic_00;
  undefined2 in_stack_ffffffffffffff78;
  byte in_stack_ffffffffffffff7a;
  byte in_stack_ffffffffffffff7b;
  float in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  byte is_logarithmic_01;
  int in_stack_ffffffffffffff98;
  float fVar14;
  float fVar15;
  float local_50;
  
  pIVar2 = GImGui;
  data_type_00 = (ImGuiDataType)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  uVar3 = (uint)((in_stack_00000010 & 0x100000) != 0);
  bVar6 = in_EDX == 8;
  bVar7 = in_EDX == 9;
  if (in_R8 < in_R9) {
    local_f8 = in_R9 - in_R8;
  }
  else {
    local_f8 = in_R8 - in_R9;
  }
  fVar8 = (float)local_f8;
  axis_00 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar9 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar9 = (axis_00 - fVar9) - 4.0;
  local_50 = (pIVar2->Style).GrabMinSize;
  local_114 = in_stack_ffffffffffffff74;
  if ((!bVar6 && !bVar7) && (0.0 <= fVar8)) {
    local_50 = ImMax<float>(fVar9 / (fVar8 + 1.0),(pIVar2->Style).GrabMinSize);
    local_114 = in_stack_ffffffffffffff74;
  }
  fVar10 = ImMin<float>(local_50,fVar9);
  lhs = fVar9 - fVar10;
  fVar11 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar11 = fVar10 * 0.5 + fVar11 + 2.0;
  fVar12 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar12 = -fVar10 * 0.5 + (fVar12 - 2.0);
  fVar15 = 0.0;
  fVar14 = 0.0;
  if ((in_stack_00000010 & 0x20) != 0) {
    if (bVar6 || bVar7) {
      in_stack_ffffffffffffff00 =
           ImParseFormatPrecision
                     ((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                      (int)in_stack_fffffffffffffef4);
    }
    else {
      in_stack_ffffffffffffff00 = 1;
    }
    in_stack_ffffffffffffff98 = in_stack_ffffffffffffff00;
    fVar15 = ImPow(0.0,3.697018e-39);
    in_stack_fffffffffffffefc = (pIVar2->Style).LogSliderDeadzone * 0.5;
    fVar14 = ImMax<float>(lhs,1.0);
    fVar14 = in_stack_fffffffffffffefc / fVar14;
  }
  is_logarithmic_00 = (undefined1)((uint)local_114 >> 0x18);
  is_logarithmic_01 = false;
  if (pIVar2->ActiveId == in_ESI) {
    bVar1 = false;
    in_stack_ffffffffffffff90 = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar2->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar4 = ImVec2::operator[](&(pIVar2->IO).MousePos,(long)(int)uVar3);
        in_stack_ffffffffffffff8c = *pfVar4;
        fVar8 = in_stack_fffffffffffffef8;
        if ((pIVar2->ActiveIdIsJustActivated & 1U) != 0) {
          in_stack_ffffffffffffff88 =
               ScaleRatioFromValueT<long_long,long_long,double>
                         ((ImGuiDataType)in_stack_ffffffffffffff90,
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          CONCAT44(in_stack_ffffffffffffff7c,
                                   CONCAT13(in_stack_ffffffffffffff7b,
                                            CONCAT12(in_stack_ffffffffffffff7a,
                                                     in_stack_ffffffffffffff78))),
                          (bool)is_logarithmic_00,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff6c);
          if (uVar3 == 1) {
            in_stack_ffffffffffffff88 = 1.0 - in_stack_ffffffffffffff88;
          }
          in_stack_ffffffffffffff84 = ImLerp<float>(fVar11,fVar12,in_stack_ffffffffffffff88);
          fVar8 = (float)((uint)in_stack_fffffffffffffef8 & 0xffffff);
          if ((-fVar10 * 0.5 + in_stack_ffffffffffffff84) - 1.0 <= in_stack_ffffffffffffff8c) {
            fVar8 = (float)CONCAT13(in_stack_ffffffffffffff8c <=
                                    fVar10 * 0.5 + in_stack_ffffffffffffff84 + 1.0,
                                    SUB43(in_stack_fffffffffffffef8,0));
          }
          cVar13 = (char)((uint)fVar8 >> 0x18);
          in_stack_ffffffffffffff80 = CONCAT13(cVar13,(int3)in_stack_ffffffffffffff80);
          if ((cVar13 == '\0') || (!bVar6 && !bVar7)) {
            in_stack_fffffffffffffef4 = 0.0;
          }
          else {
            in_stack_fffffffffffffef4 = in_stack_ffffffffffffff8c - in_stack_ffffffffffffff84;
          }
          pIVar2->SliderGrabClickOffset = in_stack_fffffffffffffef4;
        }
        if (0.0 < lhs) {
          in_stack_ffffffffffffff90 =
               ImSaturate(((in_stack_ffffffffffffff8c - pIVar2->SliderGrabClickOffset) - fVar11) /
                          lhs);
        }
        if (uVar3 == 1) {
          in_stack_ffffffffffffff90 = 1.0 - in_stack_ffffffffffffff90;
        }
        bVar1 = true;
        in_stack_fffffffffffffef8 = fVar8;
      }
    }
    else if ((pIVar2->ActiveIdSource == ImGuiInputSource_Keyboard) ||
            (pIVar2->ActiveIdSource == ImGuiInputSource_Gamepad)) {
      if ((pIVar2->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar2->SliderCurrentAccum = 0.0;
        pIVar2->SliderCurrentAccumDirty = false;
      }
      if (uVar3 == 0) {
        in_stack_fffffffffffffef0 = GetNavTweakPressedAmount((ImGuiAxis)axis_00);
      }
      else {
        in_stack_fffffffffffffef0 = GetNavTweakPressedAmount((ImGuiAxis)axis_00);
        in_stack_fffffffffffffef0 = -in_stack_fffffffffffffef0;
      }
      if ((in_stack_fffffffffffffef0 != 0.0) ||
         (in_stack_ffffffffffffff7c = in_stack_fffffffffffffef0, NAN(in_stack_fffffffffffffef0))) {
        in_stack_ffffffffffffff7c = in_stack_fffffffffffffef0;
        in_stack_ffffffffffffff7b = IsKeyDown(ImGuiKey_KeysData_OFFSET);
        in_stack_ffffffffffffff7a = IsKeyDown(ImGuiKey_KeysData_OFFSET);
        if (bVar6 || bVar7) {
          local_114 = ImParseFormatPrecision
                                ((char *)CONCAT44(in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8),
                                 (int)in_stack_fffffffffffffef4);
        }
        else {
          local_114 = 0;
        }
        if (local_114 < 1) {
          if ((((-100.0 <= fVar8) && (fVar8 <= 100.0)) && ((fVar8 != 0.0 || (NAN(fVar8))))) ||
             ((in_stack_ffffffffffffff7b & 1) != 0)) {
            in_stack_ffffffffffffff7c =
                 (float)(~-(uint)(in_stack_ffffffffffffff7c < 0.0) & 0x3f800000 |
                        -(uint)(in_stack_ffffffffffffff7c < 0.0) & 0xbf800000) / fVar8;
          }
          else {
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c / 100.0;
          }
        }
        else {
          in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c / 100.0;
          if ((in_stack_ffffffffffffff7b & 1) != 0) {
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c / 10.0;
          }
        }
        if ((in_stack_ffffffffffffff7a & 1) != 0) {
          in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c * 10.0;
        }
        pIVar2->SliderCurrentAccum = in_stack_ffffffffffffff7c + pIVar2->SliderCurrentAccum;
        pIVar2->SliderCurrentAccumDirty = true;
      }
      is_logarithmic_00 = (undefined1)((uint)local_114 >> 0x18);
      in_stack_ffffffffffffff70 = pIVar2->SliderCurrentAccum;
      if ((pIVar2->NavActivatePressedId == in_ESI) && ((pIVar2->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((pIVar2->SliderCurrentAccumDirty & 1U) != 0) {
        in_stack_ffffffffffffff90 =
             ScaleRatioFromValueT<long_long,long_long,double>
                       ((ImGuiDataType)in_stack_ffffffffffffff90,
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        CONCAT44(in_stack_ffffffffffffff7c,
                                 CONCAT13(in_stack_ffffffffffffff7b,
                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                   in_stack_ffffffffffffff78))),
                        (bool)is_logarithmic_00,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c)
        ;
        if (((1.0 <= in_stack_ffffffffffffff90) && (0.0 < in_stack_ffffffffffffff70)) ||
           ((in_stack_ffffffffffffff90 <= 0.0 && (in_stack_ffffffffffffff70 < 0.0)))) {
          bVar1 = false;
          pIVar2->SliderCurrentAccum = 0.0;
        }
        else {
          bVar1 = true;
          fVar8 = ImSaturate(in_stack_ffffffffffffff90 + in_stack_ffffffffffffff70);
          lVar5 = ScaleValueFromRatioT<long_long,long_long,double>
                            ((ImGuiDataType)lhs,fVar11,CONCAT44(fVar12,fVar15),
                             CONCAT44(fVar14,in_stack_ffffffffffffff98),(bool)is_logarithmic_01,
                             fVar8,in_stack_ffffffffffffff8c);
          data_type_00 = (ImGuiDataType)((ulong)lVar5 >> 0x20);
          in_stack_ffffffffffffff6c = in_stack_ffffffffffffff90;
          if ((bVar6 || bVar7) && ((in_stack_00000010 & 0x40) == 0)) {
            lVar5 = RoundScalarWithFormatT<long_long>
                              ((char *)CONCAT44(in_stack_ffffffffffffff90,in_stack_ffffffffffffff68)
                               ,data_type_00,
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
            data_type_00 = (ImGuiDataType)((ulong)lVar5 >> 0x20);
            in_stack_ffffffffffffff6c = in_stack_ffffffffffffff90;
          }
          in_stack_ffffffffffffff90 = fVar8;
          in_stack_ffffffffffffff5c =
               ScaleRatioFromValueT<long_long,long_long,double>
                         ((ImGuiDataType)in_stack_ffffffffffffff90,
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          CONCAT44(in_stack_ffffffffffffff7c,
                                   CONCAT13(in_stack_ffffffffffffff7b,
                                            CONCAT12(in_stack_ffffffffffffff7a,
                                                     in_stack_ffffffffffffff78))),
                          (bool)is_logarithmic_00,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff6c);
          if (in_stack_ffffffffffffff70 <= 0.0) {
            fVar8 = ImMax<float>(in_stack_ffffffffffffff5c - in_stack_ffffffffffffff6c,
                                 in_stack_ffffffffffffff70);
            pIVar2->SliderCurrentAccum = pIVar2->SliderCurrentAccum - fVar8;
          }
          else {
            fVar8 = ImMin<float>(in_stack_ffffffffffffff5c - in_stack_ffffffffffffff6c,
                                 in_stack_ffffffffffffff70);
            pIVar2->SliderCurrentAccum = pIVar2->SliderCurrentAccum - fVar8;
          }
        }
        pIVar2->SliderCurrentAccumDirty = false;
      }
    }
    if ((bVar1) &&
       ((((pIVar2->LastItemData).InFlags & 0x800U) != 0 || ((in_stack_00000010 & 0x200000) != 0))))
    {
      bVar1 = false;
    }
    if (bVar1) {
      local_b0 = ScaleValueFromRatioT<long_long,long_long,double>
                           ((ImGuiDataType)lhs,fVar11,CONCAT44(fVar12,fVar15),
                            CONCAT44(fVar14,in_stack_ffffffffffffff98),(bool)is_logarithmic_01,
                            in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      if ((bVar6 || bVar7) && ((in_stack_00000010 & 0x40) == 0)) {
        local_b0 = RoundScalarWithFormatT<long_long>
                             ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              data_type_00,
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      if (*in_RCX != local_b0) {
        *in_RCX = local_b0;
        is_logarithmic_01 = 1;
      }
    }
  }
  if (1.0 <= fVar9) {
    local_c4 = ScaleRatioFromValueT<long_long,long_long,double>
                         ((ImGuiDataType)in_stack_ffffffffffffff90,
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          CONCAT44(in_stack_ffffffffffffff7c,
                                   CONCAT13(in_stack_ffffffffffffff7b,
                                            CONCAT12(in_stack_ffffffffffffff7a,
                                                     in_stack_ffffffffffffff78))),
                          (bool)is_logarithmic_00,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff6c);
    if (uVar3 == 1) {
      local_c4 = 1.0 - local_c4;
    }
    ImLerp<float>(fVar11,fVar12,local_c4);
    if (uVar3 == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(axis_00,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
                     ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
      ;
      *in_stack_00000018 = local_d8;
      in_stack_00000018[1] = local_d0;
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(axis_00,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
                     ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
      ;
      *in_stack_00000018 = local_e8;
      in_stack_00000018[1] = local_e0;
    }
  }
  else {
    ImRect::ImRect(&local_c0,in_RDI,in_RDI);
    *in_stack_00000018 = local_c0.Min;
    in_stack_00000018[1] = local_c0.Max;
  }
  return (bool)(is_logarithmic_01 & 1);
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const float v_range_f = (float)(v_min < v_max ? v_max - v_min : v_min - v_max); // We don't need high precision for what we do with it.

    // Calculate bounds
    const float grab_padding = 2.0f; // FIXME: Should be part of style.
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    if (!is_floating_point && v_range_f >= 0.0f)                         // v_range_f < 0 may happen on integer overflows
        grab_sz = ImMax(slider_sz / (v_range_f + 1), style.GrabMinSize); // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                if (g.ActiveIdIsJustActivated)
                {
                    float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (axis == ImGuiAxis_Y)
                        grab_t = 1.0f - grab_t;
                    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
                    const bool clicked_around_grab = (mouse_abs_pos >= grab_pos - grab_sz * 0.5f - 1.0f) && (mouse_abs_pos <= grab_pos + grab_sz * 0.5f + 1.0f); // No harm being extra generous here.
                    g.SliderGrabClickOffset = (clicked_around_grab && is_floating_point) ? mouse_abs_pos - grab_pos : 0.0f;
                }
                if (slider_usable_sz > 0.0f)
                    clicked_t = ImSaturate((mouse_abs_pos - g.SliderGrabClickOffset - slider_usable_pos_min) / slider_usable_sz);
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Keyboard || g.ActiveIdSource == ImGuiInputSource_Gamepad)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            float input_delta = (axis == ImGuiAxis_X) ? GetNavTweakPressedAmount(axis) : -GetNavTweakPressedAmount(axis);
            if (input_delta != 0.0f)
            {
                const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
                const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (tweak_slow)
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range_f >= -100.0f && v_range_f <= 100.0f && v_range_f != 0.0f) || tweak_slow)
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / v_range_f; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (tweak_fast)
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
            if ((g.LastItemData.InFlags & ImGuiItemFlags_ReadOnly) || (flags & ImGuiSliderFlags_ReadOnly))
                set_new_value = false;

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}